

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelEvent.cpp
# Opt level: O2

void __thiscall MIDI::ChannelEvent::debug(ChannelEvent *this)

{
  ostream *poVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  
  switch(this->_command) {
  case '\0':
    poVar1 = std::operator<<((ostream *)&std::cout,"\tInvalid MIDI Channel Event");
    goto LAB_00106c1a;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"\tUnknown MIDI Channel Event");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tCommand: 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tChannel: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_channel);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tParam 1: 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_param1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tParam 2: 0x";
    goto LAB_00106bf2;
  case '\b':
    pcVar5 = "\tEnd Note ";
    goto LAB_00106ac3;
  case '\t':
    pcVar5 = "\tStart Note ";
LAB_00106ac3:
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_param1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tVelocity: ";
    break;
  case '\n':
    poVar1 = std::operator<<((ostream *)&std::cout,"\tNote Aftertouch");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_param1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tValue: ";
    break;
  case '\v':
    poVar1 = std::operator<<((ostream *)&std::cout,"\tController Event");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tChannel: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_channel);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tType: 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_param1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tValue: 0x";
LAB_00106bf2:
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar5);
    lVar2 = *(long *)(*(long *)poVar1 + -0x18);
    uVar3 = *(uint *)(poVar1 + lVar2 + 0x18) & 0xffffffb5 | 8;
    goto LAB_00106c0b;
  case '\f':
    pcVar5 = "\tProgram Change to ";
    goto LAB_00106a32;
  case '\r':
    poVar1 = std::operator<<((ostream *)&std::cout,"\tChannel Aftertouch");
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tValue: ";
LAB_00106a32:
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    iVar4 = this->_param1;
    goto LAB_00106c12;
  case '\x0e':
    poVar1 = std::operator<<((ostream *)&std::cout,"\tPitch Bend");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\t\tPitch Value (MSB): ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_param1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar5 = "\t\tPitch Value (LSB): ";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar5);
  lVar2 = *(long *)(*(long *)poVar1 + -0x18);
  uVar3 = *(uint *)(poVar1 + lVar2 + 0x18) & 0xffffffb5 | 2;
LAB_00106c0b:
  *(uint *)(poVar1 + lVar2 + 0x18) = uVar3;
  iVar4 = this->_param2;
LAB_00106c12:
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
LAB_00106c1a:
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ChannelEvent::debug()
  {
    switch(_command)
      {
      case MIDI_CHEVENT_INVALID:
	cout << "\tInvalid MIDI Channel Event" << endl;
	break;
      case MIDI_CHEVENT_NOTEOFF:
	cout << "\tEnd Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEON:
	cout << "\tStart Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEAFTERTOUCH:
	cout << "\tNote Aftertouch" << setbase(10) << _param1 << endl;
	cout << "\t\tValue: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_CONTROLLER:
	cout << "\tController Event" << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tType: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tValue: 0x" << setbase(16) << _param2 << endl;
	break;
      case MIDI_CHEVENT_PROGRAMCHANGE:
	cout << "\tProgram Change to " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_CHANNELAFTERTOUCH:
	cout << "\tChannel Aftertouch" << endl;
	cout << "\t\tValue: " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_PITCHBEND:
	cout << "\tPitch Bend" << endl;
	cout << "\t\tPitch Value (MSB): " << setbase(10) << _param1 << endl;
	cout << "\t\tPitch Value (LSB): " << setbase(10) << _param2 << endl;
	break;
      default:
	cout << "\tUnknown MIDI Channel Event" << endl;
	cout << "\t\tCommand: 0x" << setbase(16) << (unsigned int)_command << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tParam 1: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tParam 2: 0x" << setbase(16) << _param2 << endl;
	break;
      }   
  }